

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# names.h
# Opt level: O2

Name wasm::Names::getValidLocalName(Function *func,Name root)

{
  size_t sVar1;
  string *in_R9;
  Name root_00;
  IString IVar2;
  string local_68 [32];
  _Any_data local_48;
  code *local_38;
  code *local_30;
  allocator<char> local_21;
  
  local_48._8_8_ = 0;
  local_30 = std::
             _Function_handler<bool_(wasm::Name),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/names.h:121:5)>
             ::_M_invoke;
  local_38 = std::
             _Function_handler<bool_(wasm::Name),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/names.h:121:5)>
             ::_M_manager;
  local_48._M_unused._M_object = func;
  sVar1 = Function::getNumLocals(func);
  std::__cxx11::string::string<std::allocator<char>>(local_68,"_",&local_21);
  root_00.super_IString.str._M_str = (char *)&local_48;
  root_00.super_IString.str._M_len = (size_t)root.super_IString.str._M_str;
  IVar2.str = (string_view)
              getValidName(root.super_IString.str._M_len,root_00,
                           (function<bool_(wasm::Name)> *)(sVar1 & 0xffffffff),(Index)local_68,in_R9
                          );
  std::__cxx11::string::~string(local_68);
  std::_Function_base::~_Function_base((_Function_base *)&local_48);
  return (IString)(IString)IVar2.str;
}

Assistant:

inline Name getValidLocalName(Function& func, Name root) {
  return getValidName(
    root,
    [&](Name test) { return !func.hasLocalIndex(test); },
    func.getNumLocals());
}